

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testIoPerformance(void)

{
  size_t size;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  uint64_t uVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  void *src;
  void *dst;
  ssize_t sVar15;
  char *pcVar16;
  ulong uVar17;
  ulong count;
  File simpleFileDst;
  File simpleFileSrc;
  RecordFileHdr hdr;
  Record rec;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  MappedFile mappedFileSrc;
  MappedFile mappedFileDst;
  File local_280;
  File local_27c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_278;
  uint64_t local_240;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_238;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_218;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_1f8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_1d8;
  Time local_1ac;
  undefined1 local_198 [184];
  MappedFile local_e0;
  
  local_27c.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_280.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_198[0x10] = 0;
  local_198._17_7_ = 0;
  local_198[0x18] = false;
  local_198._0_8_ = (C *)0x0;
  local_198[8] = 0;
  local_198._9_7_ = 0;
  sVar11 = strlen(testIoPerformance::fileNameSrc);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198,(BufHdr *)0x0);
  local_198._0_8_ = testIoPerformance::fileNameSrc;
  local_198[0x10] = (undefined1)sVar11;
  local_198._17_7_ = (undefined7)(sVar11 >> 8);
  local_198[0x18] = true;
  iVar9 = axl::io::File::open(&local_27c,local_198,1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198);
  if ((char)iVar9 == '\0') {
    axl::err::getLastErrorDescription();
    pcVar16 = (char *)local_198._0_8_;
    if (CONCAT71(local_198._17_7_,local_198[0x10]) == 0) {
      pcVar16 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    printf("can\'t open %s: %s\n",testIoPerformance::fileNameSrc,pcVar16);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)local_198);
    goto LAB_00112e6c;
  }
  local_218.m_p = (char *)0x0;
  local_218.m_hdr = (Hdr *)0x0;
  local_218.m_count = 0;
  axl::io::MappedFile::MappedFile((MappedFile *)local_198);
  axl::io::MappedFile::MappedFile(&local_e0);
  local_278.m_length._0_1_ = 0;
  local_278.m_length._1_7_ = 0;
  local_278.m_isNullTerminated = false;
  local_278.m_p = (C *)0x0;
  local_278.m_hdr._0_1_ = 0;
  local_278.m_hdr._1_7_ = 0;
  sVar11 = strlen(testIoPerformance::fileNameSrc);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_278,(BufHdr *)0x0);
  local_278.m_p = testIoPerformance::fileNameSrc;
  local_278.m_length._0_1_ = (undefined1)sVar11;
  local_278.m_length._1_7_ = (undefined7)(sVar11 >> 8);
  local_278.m_isNullTerminated = true;
  iVar9 = axl::io::MappedFile::open((MappedFile *)local_198,(char *)&local_278,1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
  if ((char)iVar9 == '\0') {
LAB_001129c9:
    bVar8 = false;
  }
  else {
    local_1d8.m_length._0_1_ = 0;
    local_1d8.m_length._1_7_ = 0;
    local_1d8.m_isNullTerminated = false;
    local_1d8.m_p = (C *)0x0;
    local_1d8.m_hdr._0_1_ = 0;
    local_1d8.m_hdr._1_7_ = 0;
    sVar11 = strlen(testIoPerformance::fileNameDst_m);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_1d8,(BufHdr *)0x0);
    local_1d8.m_p = testIoPerformance::fileNameDst_m;
    local_1d8.m_length._0_1_ = (undefined1)sVar11;
    local_1d8.m_length._1_7_ = (undefined7)(sVar11 >> 8);
    local_1d8.m_isNullTerminated = true;
    iVar10 = axl::io::MappedFile::open(&local_e0,(char *)&local_1d8,0);
    if ((char)iVar10 == '\0') goto LAB_001129c9;
    bVar8 = axl::io::MappedFile::setSize(&local_e0,0);
  }
  if ((char)iVar9 != '\0') {
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_1d8);
  }
  if (bVar8 == false) {
    axl::err::getLastErrorDescription();
    pcVar16 = local_278.m_p;
    if (CONCAT71(local_278.m_length._1_7_,(undefined1)local_278.m_length) == 0) {
      pcVar16 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    printf("error: %s\n",pcVar16);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
  }
  else {
    puts("testing mapped file...");
    uVar12 = axl::sys::getTimestamp();
    puVar13 = (undefined8 *)
              axl::io::MappedFile::view((MappedFile *)local_198,0,0x30,(size_t *)0x0,true);
    local_240 = uVar12;
    puVar14 = (undefined8 *)axl::io::MappedFile::view(&local_e0,0,0x30,(size_t *)0x0,true);
    uVar2 = *puVar13;
    uVar3 = puVar13[1];
    uVar4 = puVar13[2];
    uVar5 = puVar13[3];
    uVar6 = puVar13[5];
    puVar14[4] = puVar13[4];
    puVar14[5] = uVar6;
    puVar14[2] = uVar4;
    puVar14[3] = uVar5;
    *puVar14 = uVar2;
    puVar14[1] = uVar3;
    lVar1 = puVar13[2];
    if (0x30 < lVar1 + 0x30U) {
      uVar12 = 0x30;
      do {
        src = axl::io::MappedFile::view((MappedFile *)local_198,uVar12,0x18,(size_t *)0x0,false);
        size = (ulong)*(uint *)((long)src + 0x10) + 0x18;
        if ((ulong)*(uint *)((long)src + 0x10) != 0) {
          src = axl::io::MappedFile::view((MappedFile *)local_198,uVar12,size,(size_t *)0x0,false);
        }
        dst = axl::io::MappedFile::view(&local_e0,uVar12,size,(size_t *)0x0,false);
        __wrap_memcpy(dst,src,size);
        uVar12 = uVar12 + size;
      } while (uVar12 < lVar1 + 0x30U);
    }
    uVar12 = axl::sys::getTimestamp();
    axl::sys::Time::setTimestampImpl((Time *)&local_1f8,uVar12 - local_240,false,0);
    local_238.m_length._0_4_ = 0;
    local_238.m_length._4_4_ = 0;
    local_238.m_isNullTerminated = false;
    local_238.m_p = (C *)0x0;
    local_238.m_hdr._0_1_ = 0;
    local_238.m_hdr._1_7_ = 0;
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_238,(BufHdr *)0x0);
    local_238.m_p = "%m.%s.%l";
    local_238.m_length._0_4_ = 8;
    local_238.m_length._4_4_ = 0;
    local_238.m_isNullTerminated = true;
    axl::sys::Time::format((String *)&local_278,(Time *)&local_1f8,&local_238);
    printf("Done: %s\n");
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_238);
    local_278.m_length._0_1_ = 0;
    local_278.m_length._1_7_ = 0;
    local_278.m_isNullTerminated = false;
    local_278.m_p = (C *)0x0;
    local_278.m_hdr._0_1_ = 0;
    local_278.m_hdr._1_7_ = 0;
    sVar11 = strlen(testIoPerformance::fileNameDst_s);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_278,(BufHdr *)0x0);
    local_278.m_p = testIoPerformance::fileNameDst_s;
    local_278.m_length._0_1_ = (undefined1)sVar11;
    local_278.m_length._1_7_ = (undefined7)(sVar11 >> 8);
    local_278.m_isNullTerminated = true;
    iVar9 = axl::io::File::open(&local_280,(char *)&local_278,0);
    if ((char)iVar9 == '\0') {
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
    }
    else {
      iVar9 = ftruncate64((int)local_280.m_file.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h,0);
      if (iVar9 == -1) {
        axl::err::setLastSystemError();
      }
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
      if (iVar9 != -1) {
        puts("testing simple file...");
        local_240 = axl::sys::getTimestamp();
        sVar15 = read((int)local_27c.m_file.
                           super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                      &local_278,0x30);
        if (sVar15 == -1) {
          axl::err::setLastSystemError();
        }
        sVar15 = write((int)local_280.m_file.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                       &local_278,0x30);
        if (sVar15 == -1) {
          axl::err::setLastSystemError();
        }
        uVar7 = CONCAT71(local_278.m_length._1_7_,(undefined1)local_278.m_length);
        if (uVar7 != 0) {
          uVar17 = 0;
          do {
            sVar15 = read((int)local_27c.m_file.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h,&local_238,0x18);
            if (sVar15 == -1) {
              axl::err::setLastSystemError();
            }
            count = (ulong)(uint)local_238.m_length;
            if (count != 0) {
              axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
              setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
                        ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_218,count);
              bVar8 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive
                                ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_218);
              pcVar16 = local_218.m_p;
              if (!bVar8) {
                pcVar16 = (char *)0x0;
              }
              sVar15 = read((int)local_27c.m_file.
                                 super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                 .m_h,pcVar16,count);
              if (sVar15 == -1) {
                axl::err::setLastSystemError();
              }
            }
            sVar15 = write((int)local_280.m_file.
                                super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                                m_h,&local_238,0x18);
            if (sVar15 == -1) {
              axl::err::setLastSystemError();
            }
            sVar15 = write((int)local_280.m_file.
                                super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                                m_h,local_218.m_p,count);
            if (sVar15 == -1) {
              axl::err::setLastSystemError();
            }
            uVar17 = uVar17 + count + 0x18;
          } while (uVar17 < uVar7);
        }
        uVar12 = axl::sys::getTimestamp();
        axl::sys::Time::setTimestampImpl(&local_1ac,uVar12 - local_240,false,0);
        local_1f8.m_length._0_1_ = 0;
        local_1f8.m_length._1_7_ = 0;
        local_1f8.m_isNullTerminated = false;
        local_1f8.m_p = (C *)0x0;
        local_1f8.m_hdr._0_1_ = 0;
        local_1f8.m_hdr._1_7_ = 0;
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                  (&local_1f8,(BufHdr *)0x0);
        local_1f8.m_p = "%m.%s.%l";
        local_1f8.m_length._0_1_ = 8;
        local_1f8.m_length._1_7_ = 0;
        local_1f8.m_isNullTerminated = true;
        axl::sys::Time::format((String *)&local_238,&local_1ac,&local_1f8);
        pcVar16 = local_238.m_p;
        if (CONCAT44(local_238.m_length._4_4_,(uint)local_238.m_length) == 0) {
          pcVar16 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        printf("Done: %s\n",pcVar16);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_238);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_1f8);
        goto LAB_00112e48;
      }
    }
    axl::err::getLastErrorDescription();
    pcVar16 = local_278.m_p;
    if (CONCAT71(local_278.m_length._1_7_,(undefined1)local_278.m_length) == 0) {
      pcVar16 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    printf("error: %s\n",pcVar16);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_278);
  }
LAB_00112e48:
  axl::io::MappedFile::~MappedFile(&local_e0);
  axl::io::MappedFile::~MappedFile((MappedFile *)local_198);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_218);
LAB_00112e6c:
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_280);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_27c);
  return;
}

Assistant:

void
testIoPerformance() {
	#define _READ_ONLY 0
	#define _DUMMY_WRITE 0

	io::File simpleFileSrc;
#if (!_READ_ONLY)
	io::File simpleFileDst;
#endif

	static char fileNameSrc[] = "G:/Temp/Test MTK TCP/Test MTK TCP.njlog";
	static char fileNameDst_s[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 2.njlog";
	static char fileNameDst_m[] = "G:/Temp/Test MTK TCP/Test MTK TCP - 3.njlog";

	bool result = simpleFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);
	if (!result) {
		printf("can't open %s: %s\n", fileNameSrc, err::getLastErrorDescription().sz());
		return;
	}

	uint64_t baseTimestamp;
	uint64_t time;
	uint64_t offset;

	sl::Array<char> buffer;

	struct Rec: Record {
		char m_data[1024];
	};

	Rec staticRec;
	memset(&staticRec, 0, sizeof(staticRec));
	staticRec.m_dataSize = sizeof(staticRec.m_data);

	io::MappedFile mappedFileSrc;
	io::MappedFile mappedFileDst;

	result = mappedFileSrc.open(fileNameSrc, io::FileFlag_ReadOnly);

#if (!_READ_ONLY)
	result =
		result &&
		mappedFileDst.open(fileNameDst_m) &&
		mappedFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing mapped file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr* hdr2 = (RecordFileHdr*)mappedFileSrc.view(0, sizeof(RecordFileHdr), true);

#if (!_READ_ONLY)
	RecordFileHdr* hdr3 = (RecordFileHdr*)mappedFileDst.view(0, sizeof(RecordFileHdr), true);
	*hdr3 = *hdr2;
#endif

	offset = sizeof(RecordFileHdr);
	uint64_t endOffset = offset + hdr2->m_totalRecordSize;

	while (offset < endOffset) {
#if (_DUMMY_WRITE)
		Record* rec = &staticRec;
		size_t recSize = sizeof(rec);
#else
		Record* rec = (Record*)mappedFileSrc.view(offset, sizeof(Record));
		size_t recSize = sizeof(Record) + rec->m_dataSize;
		if (rec->m_dataSize)
			rec = (Record*)mappedFileSrc.view(offset, recSize);
#endif

#if (!_READ_ONLY)
		void* p = mappedFileDst.view(offset, recSize);
		memcpy(p, rec, recSize);
#endif

		offset += recSize;
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());

#if (!_READ_ONLY)
	result =
		result	&&
		simpleFileDst.open(fileNameDst_s) &&
		simpleFileDst.setSize(0);
#endif

	if (!result) {
		printf("error: %s\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("testing simple file...\n");
	baseTimestamp = sys::getTimestamp();

	RecordFileHdr hdr;
	simpleFileSrc.read(&hdr, sizeof(hdr));

#if (!_READ_ONLY)
	simpleFileDst.write(&hdr, sizeof(hdr));
#endif

	offset = 0;
	while (offset < hdr.m_totalRecordSize) {
#if (!_DUMMY_WRITE)
		Record rec;
		simpleFileSrc.read(&rec, sizeof(rec));
		if (rec.m_dataSize) {
			buffer.setCount(rec.m_dataSize);
			simpleFileSrc.read(buffer.p(), rec.m_dataSize);
		}

#	if (!_READ_ONLY)
		simpleFileDst.write(&rec, sizeof(rec));
		simpleFileDst.write(buffer, rec.m_dataSize);
#	endif

		offset += sizeof(rec) + rec.m_dataSize;
#else
		simpleFileDst.write(&staticRec, sizeof(staticRec));
		offset += sizeof(staticRec);
#endif
	}

	time = sys::getTimestamp() - baseTimestamp;
	printf("Done: %s\n", sys::Time(time, 0).format("%m.%s.%l").sz());
}